

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-pool.c
# Opt level: O3

void data_pool_destroy(MMDB_data_pool_s *pool)

{
  size_t i;
  ulong uVar1;
  
  if (pool != (MMDB_data_pool_s *)0x0) {
    uVar1 = 0;
    do {
      free(pool->blocks[uVar1]);
      uVar1 = uVar1 + 1;
    } while (uVar1 <= pool->index);
    free(pool);
    return;
  }
  return;
}

Assistant:

void data_pool_destroy(MMDB_data_pool_s *const pool) {
    if (!pool) {
        return;
    }

    for (size_t i = 0; i <= pool->index; i++) {
        free(pool->blocks[i]);
    }

    free(pool);
}